

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall
fasttext::Dictionary::addWordNgrams
          (Dictionary *this,vector<int,_std::allocator<int>_> *line,
          vector<int,_std::allocator<int>_> *hashes,int32_t n)

{
  pointer piVar1;
  pointer piVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int32_t j;
  ulong uVar7;
  ulong uVar8;
  
  lVar5 = 0x100000000;
  piVar1 = (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar8 = 1;
  for (uVar3 = 0; uVar3 < (ulong)((long)piVar2 - (long)piVar1 >> 2); uVar3 = uVar3 + 1) {
    uVar4 = (ulong)piVar1[uVar3];
    uVar7 = uVar8;
    for (lVar6 = lVar5;
        (uVar7 < (ulong)((long)piVar2 - (long)piVar1 >> 2) &&
        (lVar6 >> 0x20 < (long)(uVar3 + (long)n))); lVar6 = lVar6 + 0x100000000) {
      uVar4 = (long)piVar1[uVar7] + uVar4 * 0x6eac5db;
      pushHash(this,line,
               (int32_t)(uVar4 % (ulong)(long)((this->args_).
                                               super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr)->bucket));
      uVar7 = uVar7 + 1;
      piVar1 = (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    uVar8 = uVar8 + 1;
    lVar5 = lVar5 + 0x100000000;
  }
  return;
}

Assistant:

void Dictionary::addWordNgrams(std::vector<int32_t>& line,
                               const std::vector<int32_t>& hashes,
                               int32_t n) const {
  for (int32_t i = 0; i < hashes.size(); i++) {
    uint64_t h = hashes[i];
    for (int32_t j = i + 1; j < hashes.size() && j < i + n; j++) {
      h = h * 116049371 + hashes[j];
      pushHash(line, h % args_->bucket);
    }
  }
}